

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::detail::make_digest_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Request *req,
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *auth,size_t cnonce_count,string *cnonce,string *username,string *password,bool is_proxy
            )

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  int iVar7;
  const_iterator cVar8;
  long lVar9;
  mapped_type *pmVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long *plVar15;
  ulong *puVar16;
  size_type *psVar17;
  size_type *psVar18;
  size_type *psVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  ulong uVar22;
  char *pcVar23;
  code *pcVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  undefined8 uStack_4d8;
  uint auStack_4d0 [22];
  ios_base local_478 [112];
  char acStack_408 [152];
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2f0;
  size_type *local_2e8;
  string response;
  string nc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  string *local_288;
  size_type *local_280;
  string algo;
  long local_258;
  ulong local_250;
  long lStack_248;
  ulong *local_240;
  long local_238;
  ulong local_230;
  long lStack_228;
  key_type local_220;
  key_type local_200;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  Request *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  size_type *local_178;
  long local_170;
  size_type local_168;
  long lStack_160;
  undefined1 local_158 [8];
  string qop;
  ulong local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  key_type local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  undefined1 local_b8 [8];
  mapped_type opaque;
  ulong local_88;
  long lStack_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  long local_48;
  long lStack_40;
  string *local_38;
  
  response.field_2._8_8_ = &nc._M_string_length;
  nc._M_dataplus._M_p = (pointer)0x0;
  nc._M_string_length._0_1_ = 0;
  local_2f0 = __return_storage_ptr__;
  local_288 = cnonce;
  local_38 = username;
  std::__cxx11::stringstream::stringstream((stringstream *)local_4f8);
  lVar9 = *(long *)(local_4e8._M_allocated_capacity - 0x18);
  if (acStack_408[lVar9 + 1] == '\0') {
    std::ios::widen((char)&local_4e8 + (char)lVar9);
    acStack_408[lVar9 + 1] = '\x01';
  }
  acStack_408[lVar9] = '0';
  *(undefined8 *)((long)auStack_4d0 + *(long *)(local_4e8._M_allocated_capacity - 0x18) + -8) = 8;
  *(uint *)((long)auStack_4d0 + *(long *)(local_4e8._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_4d0 + *(long *)(local_4e8._M_allocated_capacity - 0x18)) & 0xffffffb5
       | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_4e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)(response.field_2._M_local_buf + 8),(string *)local_158)
  ;
  if (local_158 != (undefined1  [8])&qop._M_string_length) {
    operator_delete((void *)local_158,
                    CONCAT71(qop._M_string_length._1_7_,(undefined1)qop._M_string_length) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_4f8);
  std::ios_base::~ios_base(local_478);
  local_158 = (undefined1  [8])&qop._M_string_length;
  qop._M_dataplus._M_p = (pointer)0x0;
  qop._M_string_length._0_1_ = 0;
  local_4f8 = (undefined1  [8])&local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"qop","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_4f8);
  p_Var1 = &(auth->_M_t)._M_impl.super__Rb_tree_header;
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar8._M_node != p_Var1) {
    local_4f8 = (undefined1  [8])&local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"qop","");
    local_1c0 = req;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(auth,(key_type *)local_4f8);
    std::__cxx11::string::_M_assign((string *)local_158);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
    }
    pcVar23 = "auth-int";
    lVar9 = std::__cxx11::string::find(local_158,0x1f4e97,0);
    if (lVar9 == -1) {
      pcVar23 = "auth";
      lVar9 = std::__cxx11::string::find(local_158,0x1f4ea0,0);
      if (lVar9 == -1) {
        qop._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_158 = '\0';
        req = local_1c0;
        goto LAB_001b1c82;
      }
    }
    std::__cxx11::string::_M_replace((ulong)local_158,0,qop._M_dataplus._M_p,(ulong)pcVar23);
    req = local_1c0;
  }
LAB_001b1c82:
  local_280 = &algo._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"MD5","");
  local_4f8 = (undefined1  [8])&local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"algorithm","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_4f8);
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar8._M_node != p_Var1) {
    local_4f8 = (undefined1  [8])&local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"algorithm","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(auth,(key_type *)local_4f8);
    std::__cxx11::string::_M_assign((string *)&local_280);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
    }
  }
  local_2e8 = &response._M_string_length;
  response._M_dataplus._M_p = (pointer)0x0;
  response._M_string_length._0_1_ = 0;
  iVar7 = std::__cxx11::string::compare((char *)&local_280);
  if (iVar7 == 0) {
    pcVar24 = SHA_256;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)&local_280);
    pcVar24 = MD5;
    if (iVar7 == 0) {
      pcVar24 = SHA_512;
    }
  }
  field.field_2._8_8_ = &local_48;
  pcVar3 = (local_38->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&field.field_2 + 8),pcVar3,pcVar3 + local_38->_M_string_length);
  std::__cxx11::string::append(field.field_2._M_local_buf + 8);
  opaque.field_2._8_8_ = &stack0xffffffffffffff78;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&opaque.field_2 + 8),"realm","");
  local_1c0 = (Request *)p_Var1;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(auth,(key_type *)((long)&opaque.field_2 + 8));
  plVar11 = (long *)std::__cxx11::string::_M_append
                              (field.field_2._M_local_buf + 8,(ulong)(pmVar10->_M_dataplus)._M_p);
  psVar17 = &field._M_string_length;
  psVar13 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar13) {
    field._M_string_length = *psVar13;
    field.field_2._M_allocated_capacity = plVar11[3];
    local_78 = (undefined1  [8])psVar17;
  }
  else {
    field._M_string_length = *psVar13;
    local_78 = (undefined1  [8])*plVar11;
  }
  field._M_dataplus._M_p = (pointer)plVar11[1];
  *plVar11 = (long)psVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(local_78);
  psVar13 = &opaque._M_string_length;
  psVar19 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar19) {
    opaque._M_string_length = *psVar19;
    opaque.field_2._M_allocated_capacity = plVar11[3];
    local_b8 = (undefined1  [8])psVar13;
  }
  else {
    opaque._M_string_length = *psVar19;
    local_b8 = (undefined1  [8])*plVar11;
  }
  opaque._M_dataplus._M_p = (pointer)plVar11[1];
  *plVar11 = (long)psVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append(local_b8,(ulong)(password->_M_dataplus)._M_p);
  local_4f8 = (undefined1  [8])&local_4e8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar14) {
    local_4e8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_4e8._8_8_ = plVar11[3];
  }
  else {
    local_4e8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_4f8 = (undefined1  [8])*plVar11;
  }
  _ss = (pointer)plVar11[1];
  *plVar11 = (long)paVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if (local_b8 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_b8,opaque._M_string_length + 1);
  }
  if (local_78 != (undefined1  [8])psVar17) {
    operator_delete((void *)local_78,field._M_string_length + 1);
  }
  if ((ulong *)opaque.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)opaque.field_2._8_8_,local_88 + 1);
  }
  if ((long *)field.field_2._8_8_ != &local_48) {
    operator_delete((void *)field.field_2._8_8_,local_48 + 1);
  }
  pcVar3 = (req->method)._M_dataplus._M_p;
  local_78 = (undefined1  [8])psVar17;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar3,pcVar3 + (req->method)._M_string_length);
  std::__cxx11::string::append(local_78);
  plVar11 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)(req->path)._M_dataplus._M_p);
  psVar19 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar19) {
    opaque._M_string_length = *psVar19;
    opaque.field_2._M_allocated_capacity = plVar11[3];
    local_b8 = (undefined1  [8])psVar13;
  }
  else {
    opaque._M_string_length = *psVar19;
    local_b8 = (undefined1  [8])*plVar11;
  }
  opaque._M_dataplus._M_p = (pointer)plVar11[1];
  *plVar11 = (long)psVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if (local_78 != (undefined1  [8])psVar17) {
    operator_delete((void *)local_78,field._M_string_length + 1);
  }
  iVar7 = std::__cxx11::string::compare(local_158);
  if (iVar7 == 0) {
    (*pcVar24)((undefined1 *)((long)&field.field_2 + 8));
    plVar11 = (long *)std::__cxx11::string::replace
                                ((ulong)((long)&field.field_2 + 8),0,(char *)0x0,0x1ebe0d);
    psVar13 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar13) {
      field._M_string_length = *psVar13;
      field.field_2._M_allocated_capacity = plVar11[3];
      local_78 = (undefined1  [8])psVar17;
    }
    else {
      field._M_string_length = *psVar13;
      local_78 = (undefined1  [8])*plVar11;
    }
    field._M_dataplus._M_p = (pointer)plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::_M_append(local_b8,(ulong)local_78);
    if (local_78 != (undefined1  [8])psVar17) {
      operator_delete((void *)local_78,field._M_string_length + 1);
    }
    if ((long *)field.field_2._8_8_ != &local_48) {
      operator_delete((void *)field.field_2._8_8_,local_48 + 1);
    }
  }
  if (qop._M_dataplus._M_p == (pointer)0x0) {
    (*pcVar24)(&local_178,local_4f8);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_178);
    local_118 = &local_108;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_108 = *plVar15;
      lStack_100 = plVar11[3];
    }
    else {
      local_108 = *plVar15;
      local_118 = (long *)*plVar11;
    }
    local_110 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"nonce","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(auth,&local_f8);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_118,(ulong)(pmVar10->_M_dataplus)._M_p);
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_128 = *puVar16;
      lStack_120 = plVar11[3];
      qop.field_2._8_8_ = &local_128;
    }
    else {
      local_128 = *puVar16;
      qop.field_2._8_8_ = (ulong *)*plVar11;
    }
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append(qop.field_2._M_local_buf + 8);
    opaque.field_2._8_8_ = &stack0xffffffffffffff78;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_88 = *puVar16;
      lStack_80 = plVar11[3];
    }
    else {
      local_88 = *puVar16;
      opaque.field_2._8_8_ = (ulong *)*plVar11;
    }
    lVar9 = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    (*pcVar24)(&local_d8,local_b8);
    uVar22 = 0xf;
    if ((ulong *)opaque.field_2._8_8_ != &stack0xffffffffffffff78) {
      uVar22 = local_88;
    }
    if (uVar22 < (ulong)(local_d0 + lVar9)) {
      uVar22 = 0xf;
      if (local_d8 != &local_c8) {
        uVar22 = local_c8;
      }
      if (uVar22 < (ulong)(local_d0 + lVar9)) goto LAB_001b290a;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,opaque.field_2._8_8_);
    }
    else {
LAB_001b290a:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append(opaque.field_2._M_local_buf + 8,(ulong)local_d8);
    }
    field.field_2._8_8_ = &local_48;
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_48 = *plVar11;
      lStack_40 = puVar12[3];
    }
    else {
      local_48 = *plVar11;
      field.field_2._8_8_ = (long *)*puVar12;
    }
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)plVar11 = 0;
    (*pcVar24)(local_78,(undefined1 *)((long)&field.field_2 + 8));
    std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_78);
    if (local_78 != (undefined1  [8])&field._M_string_length) {
      operator_delete((void *)local_78,field._M_string_length + 1);
    }
    if ((long *)field.field_2._8_8_ != &local_48) {
      operator_delete((void *)field.field_2._8_8_,local_48 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if ((ulong *)opaque.field_2._8_8_ != &stack0xffffffffffffff78) {
      operator_delete((void *)opaque.field_2._8_8_,local_88 + 1);
    }
    if ((ulong *)qop.field_2._8_8_ != &local_128) {
      operator_delete((void *)qop.field_2._8_8_,local_128 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    uVar20 = local_168;
    uVar21 = local_178;
    if (local_178 != &local_168) goto LAB_001b2a72;
  }
  else {
    (*pcVar24)((undefined1 *)((long)&nc.field_2 + 8),local_4f8);
    plVar11 = (long *)std::__cxx11::string::append(nc.field_2._M_local_buf + 8);
    local_198 = &local_188;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_188 = *plVar15;
      uStack_180 = (undefined4)plVar11[3];
      uStack_17c = *(undefined4 *)((long)plVar11 + 0x1c);
    }
    else {
      local_188 = *plVar15;
      local_198 = (long *)*plVar11;
    }
    local_190 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"nonce","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(auth,&local_220);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_198,(ulong)(pmVar10->_M_dataplus)._M_p);
    local_1e0 = &local_1d0;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_1d0 = *plVar15;
      lStack_1c8 = plVar11[3];
    }
    else {
      local_1d0 = *plVar15;
      local_1e0 = (long *)*plVar11;
    }
    local_1d8 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    local_1b8 = &local_1a8;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_1a8 = *plVar15;
      lStack_1a0 = plVar11[3];
    }
    else {
      local_1a8 = *plVar15;
      local_1b8 = (long *)*plVar11;
    }
    local_1b0 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_1b8,response.field_2._8_8_);
    local_d8 = &local_c8;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_c8 = *puVar16;
      lStack_c0 = plVar11[3];
    }
    else {
      local_c8 = *puVar16;
      local_d8 = (ulong *)*plVar11;
    }
    local_d0 = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    psVar17 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_f8.field_2._M_allocated_capacity = *psVar17;
      local_f8.field_2._8_8_ = plVar11[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar17;
      local_f8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_f8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_f8,(ulong)(local_288->_M_dataplus)._M_p);
    local_178 = &local_168;
    psVar18 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar18) {
      local_168 = *psVar18;
      lStack_160 = plVar11[3];
    }
    else {
      local_168 = *psVar18;
      local_178 = (size_type *)*plVar11;
    }
    local_170 = plVar11[1];
    *plVar11 = (long)psVar18;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_178);
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_108 = *plVar15;
      lStack_100 = plVar11[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *plVar15;
      local_118 = (long *)*plVar11;
    }
    local_110 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_158);
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_128 = *puVar16;
      lStack_120 = plVar11[3];
      qop.field_2._8_8_ = &local_128;
    }
    else {
      local_128 = *puVar16;
      qop.field_2._8_8_ = (ulong *)*plVar11;
    }
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append(qop.field_2._M_local_buf + 8);
    opaque.field_2._8_8_ = &stack0xffffffffffffff78;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_88 = *puVar16;
      lStack_80 = plVar11[3];
    }
    else {
      local_88 = *puVar16;
      opaque.field_2._8_8_ = (ulong *)*plVar11;
    }
    lVar9 = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    (*pcVar24)(&local_200,local_b8);
    uVar22 = 0xf;
    if ((ulong *)opaque.field_2._8_8_ != &stack0xffffffffffffff78) {
      uVar22 = local_88;
    }
    if (uVar22 < local_200._M_string_length + lVar9) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        uVar20 = local_200.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_200._M_string_length + lVar9) goto LAB_001b2557;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,opaque.field_2._8_8_);
    }
    else {
LAB_001b2557:
      puVar12 = (undefined8 *)
                std::__cxx11::string::_M_append
                          (opaque.field_2._M_local_buf + 8,(ulong)local_200._M_dataplus._M_p);
    }
    field.field_2._8_8_ = &local_48;
    plVar11 = puVar12 + 2;
    if ((long *)*puVar12 == plVar11) {
      local_48 = *plVar11;
      lStack_40 = puVar12[3];
    }
    else {
      local_48 = *plVar11;
      field.field_2._8_8_ = (long *)*puVar12;
    }
    *puVar12 = plVar11;
    puVar12[1] = 0;
    *(undefined1 *)plVar11 = 0;
    (*pcVar24)(local_78,(undefined1 *)((long)&field.field_2 + 8));
    std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_78);
    if (local_78 != (undefined1  [8])&field._M_string_length) {
      operator_delete((void *)local_78,field._M_string_length + 1);
    }
    if ((long *)field.field_2._8_8_ != &local_48) {
      operator_delete((void *)field.field_2._8_8_,local_48 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)opaque.field_2._8_8_ != &stack0xffffffffffffff78) {
      operator_delete((void *)opaque.field_2._8_8_,local_88 + 1);
    }
    if ((ulong *)qop.field_2._8_8_ != &local_128) {
      operator_delete((void *)qop.field_2._8_8_,local_128 + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
    uVar20 = local_298._M_allocated_capacity;
    uVar21 = nc.field_2._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nc.field_2._8_8_ != &local_298) {
LAB_001b2a72:
      operator_delete((void *)uVar21,uVar20 + 1);
    }
  }
  psVar17 = &opaque._M_string_length;
  if (local_b8 != (undefined1  [8])psVar17) {
    operator_delete((void *)local_b8,opaque._M_string_length + 1);
  }
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  local_4f8 = (undefined1  [8])&local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"opaque","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_4f8);
  if ((Request *)cVar8._M_node == local_1c0) {
    local_b8 = (undefined1  [8])psVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
  }
  else {
    local_78 = (undefined1  [8])&field._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"opaque","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(auth,(key_type *)local_78);
    pcVar3 = (pmVar10->_M_dataplus)._M_p;
    local_b8 = (undefined1  [8])psVar17;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,pcVar3,pcVar3 + pmVar10->_M_string_length);
    if (local_78 != (undefined1  [8])&field._M_string_length) {
      operator_delete((void *)local_78,field._M_string_length + 1);
    }
  }
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&nc.field_2 + 8),"Digest username=\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  plVar11 = (long *)std::__cxx11::string::append(nc.field_2._M_local_buf + 8);
  local_198 = &local_188;
  plVar15 = plVar11 + 2;
  if ((long *)*plVar11 == plVar15) {
    local_188 = *plVar15;
    uStack_180 = (undefined4)plVar11[3];
    uStack_17c = *(undefined4 *)((long)plVar11 + 0x1c);
  }
  else {
    local_188 = *plVar15;
    local_198 = (long *)*plVar11;
  }
  local_190 = plVar11[1];
  *plVar11 = (long)plVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"realm","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(auth,&local_220);
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_198,(ulong)(pmVar10->_M_dataplus)._M_p);
  local_1e0 = &local_1d0;
  plVar15 = plVar11 + 2;
  if ((long *)*plVar11 == plVar15) {
    local_1d0 = *plVar15;
    lStack_1c8 = plVar11[3];
  }
  else {
    local_1d0 = *plVar15;
    local_1e0 = (long *)*plVar11;
  }
  local_1d8 = plVar11[1];
  *plVar11 = (long)plVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_1b8 = &local_1a8;
  plVar15 = plVar11 + 2;
  if ((long *)*plVar11 == plVar15) {
    local_1a8 = *plVar15;
    lStack_1a0 = plVar11[3];
  }
  else {
    local_1a8 = *plVar15;
    local_1b8 = (long *)*plVar11;
  }
  local_1b0 = plVar11[1];
  *plVar11 = (long)plVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"nonce","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at(auth,&local_200);
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1b8,(ulong)(pmVar10->_M_dataplus)._M_p);
  local_d8 = &local_c8;
  puVar16 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar16) {
    local_c8 = *puVar16;
    lStack_c0 = plVar11[3];
  }
  else {
    local_c8 = *puVar16;
    local_d8 = (ulong *)*plVar11;
  }
  local_d0 = plVar11[1];
  *plVar11 = (long)puVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar13 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_f8.field_2._M_allocated_capacity = *psVar13;
    local_f8.field_2._8_8_ = plVar11[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar13;
    local_f8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_f8._M_string_length = plVar11[1];
  *plVar11 = (long)psVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_f8,(ulong)(req->path)._M_dataplus._M_p);
  psVar18 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar18) {
    local_168 = *psVar18;
    lStack_160 = plVar11[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *psVar18;
    local_178 = (size_type *)*plVar11;
  }
  local_170 = plVar11[1];
  *plVar11 = (long)psVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_118 = &local_108;
  plVar15 = plVar11 + 2;
  if ((long *)*plVar11 == plVar15) {
    local_108 = *plVar15;
    lStack_100 = plVar11[3];
  }
  else {
    local_108 = *plVar15;
    local_118 = (long *)*plVar11;
  }
  local_110 = plVar11[1];
  *plVar11 = (long)plVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_280);
  _Var5 = qop._M_dataplus;
  puVar16 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar16) {
    local_128 = *puVar16;
    lStack_120 = plVar11[3];
    qop.field_2._8_8_ = &local_128;
  }
  else {
    local_128 = *puVar16;
    qop.field_2._8_8_ = (ulong *)*plVar11;
  }
  lVar9 = plVar11[1];
  *plVar11 = (long)puVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if (qop._M_dataplus._M_p == (pointer)0x0) {
    algo.field_2._8_8_ = &local_250;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&algo.field_2 + 8),", response=\"","");
  }
  else {
    std::operator+(&local_538,", qop=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_538);
    local_310 = &local_300;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_300 = *plVar15;
      lStack_2f8 = plVar11[3];
    }
    else {
      local_300 = *plVar15;
      local_310 = (long *)*plVar11;
    }
    local_308 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_310,response.field_2._8_8_);
    local_330 = &local_320;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_320 = *plVar15;
      lStack_318 = plVar11[3];
    }
    else {
      local_320 = *plVar15;
      local_330 = (long *)*plVar11;
    }
    local_328 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_330);
    local_350 = &local_340;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_340 = *plVar15;
      lStack_338 = plVar11[3];
    }
    else {
      local_340 = *plVar15;
      local_350 = (long *)*plVar11;
    }
    local_348 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_350,(ulong)(local_288->_M_dataplus)._M_p);
    local_370 = &local_360;
    plVar15 = plVar11 + 2;
    if ((long *)*plVar11 == plVar15) {
      local_360 = *plVar15;
      lStack_358 = plVar11[3];
    }
    else {
      local_360 = *plVar15;
      local_370 = (long *)*plVar11;
    }
    local_368 = plVar11[1];
    *plVar11 = (long)plVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_370);
    algo.field_2._8_8_ = &local_250;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_250 = *puVar16;
      lStack_248 = plVar11[3];
    }
    else {
      local_250 = *puVar16;
      algo.field_2._8_8_ = (ulong *)*plVar11;
    }
    local_258 = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
  }
  uVar22 = 0xf;
  if ((ulong *)qop.field_2._8_8_ != &local_128) {
    uVar22 = local_128;
  }
  if (uVar22 < (ulong)(local_258 + lVar9)) {
    uVar22 = 0xf;
    if ((ulong *)algo.field_2._8_8_ != &local_250) {
      uVar22 = local_250;
    }
    if (uVar22 < (ulong)(local_258 + lVar9)) goto LAB_001b3176;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)((long)&algo.field_2 + 8),0,(char *)0x0,qop.field_2._8_8_);
  }
  else {
LAB_001b3176:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append(qop.field_2._M_local_buf + 8,algo.field_2._8_8_);
  }
  opaque.field_2._8_8_ = &stack0xffffffffffffff78;
  plVar11 = puVar12 + 2;
  if ((long *)*puVar12 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = puVar12[3];
  }
  else {
    local_88 = *plVar11;
    opaque.field_2._8_8_ = (long *)*puVar12;
  }
  *puVar12 = plVar11;
  puVar12[1] = 0;
  *(undefined1 *)plVar11 = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              (opaque.field_2._M_local_buf + 8,(ulong)local_2e8);
  field.field_2._8_8_ = &local_48;
  plVar15 = plVar11 + 2;
  if ((long *)*plVar11 == plVar15) {
    local_48 = *plVar15;
    lStack_40 = plVar11[3];
  }
  else {
    local_48 = *plVar15;
    field.field_2._8_8_ = (long *)*plVar11;
  }
  *plVar11 = (long)plVar15;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(field.field_2._M_local_buf + 8);
  _Var6 = opaque._M_dataplus;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar14) {
    local_4e8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_4e8._8_8_ = plVar11[3];
    local_4f8 = (undefined1  [8])&local_4e8;
  }
  else {
    local_4e8._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_4f8 = (undefined1  [8])*plVar11;
  }
  _ss = (pointer)plVar11[1];
  *plVar11 = (long)paVar14;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  if (opaque._M_dataplus._M_p == (pointer)0x0) {
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"");
  }
  else {
    std::operator+(&local_518,", opaque=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_518);
    local_240 = &local_230;
    puVar16 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar16) {
      local_230 = *puVar16;
      lStack_228 = plVar11[3];
    }
    else {
      local_230 = *puVar16;
      local_240 = (ulong *)*plVar11;
    }
    local_238 = plVar11[1];
    *plVar11 = (long)puVar16;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
  }
  uVar20 = 0xf;
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    uVar20 = local_4e8._M_allocated_capacity;
  }
  if ((ulong)uVar20 < (ulong)(local_238 + (long)_ss)) {
    uVar22 = 0xf;
    if (local_240 != &local_230) {
      uVar22 = local_230;
    }
    if ((ulong)(local_238 + (long)_ss) <= uVar22) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_4f8);
      goto LAB_001b33b5;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_4f8,(ulong)local_240);
LAB_001b33b5:
  local_78 = (undefined1  [8])&field._M_string_length;
  psVar13 = puVar12 + 2;
  if ((size_type *)*puVar12 == psVar13) {
    field._M_string_length = *psVar13;
    field.field_2._M_allocated_capacity = puVar12[3];
  }
  else {
    field._M_string_length = *psVar13;
    local_78 = (undefined1  [8])*puVar12;
  }
  field._M_dataplus._M_p = (pointer)puVar12[1];
  *puVar12 = psVar13;
  puVar12[1] = 0;
  *(undefined1 *)psVar13 = 0;
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  if ((_Var6._M_p != (pointer)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2)) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  if ((long *)field.field_2._8_8_ != &local_48) {
    operator_delete((void *)field.field_2._8_8_,local_48 + 1);
  }
  if ((ulong *)opaque.field_2._8_8_ != &stack0xffffffffffffff78) {
    operator_delete((void *)opaque.field_2._8_8_,local_88 + 1);
  }
  if ((ulong *)algo.field_2._8_8_ != &local_250) {
    operator_delete((void *)algo.field_2._8_8_,local_250 + 1);
  }
  if (_Var5._M_p != (pointer)0x0) {
    if (local_370 != &local_360) {
      operator_delete(local_370,local_360 + 1);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p != &local_538.field_2) {
      operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
    }
  }
  if ((ulong *)qop.field_2._8_8_ != &local_128) {
    operator_delete((void *)qop.field_2._8_8_,local_128 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nc.field_2._8_8_ != &local_298) {
    operator_delete((void *)nc.field_2._8_8_,local_298._M_allocated_capacity + 1);
  }
  local_4f8 = (undefined1  [8])0x1f4d3c;
  if (is_proxy) {
    local_4f8 = (undefined1  [8])0x1f4d36;
  }
  _ss = local_4e8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ss,local_78,field._M_dataplus._M_p + (long)local_78);
  ppVar4 = local_2f0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f0,(char *)local_4f8,
             (allocator<char> *)(field.field_2._M_local_buf + 8));
  paVar2 = &(ppVar4->second).field_2;
  (ppVar4->second)._M_dataplus._M_p = (pointer)paVar2;
  if (_ss == local_4e8._M_local_buf + 8) {
    paVar2->_M_allocated_capacity = local_4e8._8_8_;
    *(undefined8 *)((long)&(ppVar4->second).field_2 + 8) = uStack_4d8;
  }
  else {
    (ppVar4->second)._M_dataplus._M_p = _ss;
    (ppVar4->second).field_2._M_allocated_capacity = local_4e8._8_8_;
  }
  (ppVar4->second)._M_string_length = local_4e8._M_allocated_capacity;
  if (local_78 != (undefined1  [8])&field._M_string_length) {
    operator_delete((void *)local_78,field._M_string_length + 1);
  }
  if (local_b8 != (undefined1  [8])psVar17) {
    operator_delete((void *)local_b8,opaque._M_string_length + 1);
  }
  if (local_2e8 != &response._M_string_length) {
    operator_delete(local_2e8,
                    CONCAT71(response._M_string_length._1_7_,(undefined1)response._M_string_length)
                    + 1);
  }
  if (local_280 != &algo._M_string_length) {
    operator_delete(local_280,algo._M_string_length + 1);
  }
  if (local_158 != (undefined1  [8])&qop._M_string_length) {
    operator_delete((void *)local_158,
                    CONCAT71(qop._M_string_length._1_7_,(undefined1)qop._M_string_length) + 1);
  }
  if ((size_type *)response.field_2._8_8_ != &nc._M_string_length) {
    operator_delete((void *)response.field_2._8_8_,
                    CONCAT71(nc._M_string_length._1_7_,(undefined1)nc._M_string_length) + 1);
  }
  return ppVar4;
}

Assistant:

inline std::pair<std::string, std::string> make_digest_authentication_header(
            const Request& req, const std::map<std::string, std::string>& auth,
            size_t cnonce_count, const std::string& cnonce, const std::string& username,
            const std::string& password, bool is_proxy = false) {
            std::string nc;
            {
                std::stringstream ss;
                ss << std::setfill('0') << std::setw(8) << std::hex << cnonce_count;
                nc = ss.str();
            }

            std::string qop;
            if (auth.find("qop") != auth.end()) {
                qop = auth.at("qop");
                if (qop.find("auth-int") != std::string::npos) {
                    qop = "auth-int";
                } else if (qop.find("auth") != std::string::npos) {
                    qop = "auth";
                } else {
                    qop.clear();
                }
            }

            std::string algo = "MD5";
            if (auth.find("algorithm") != auth.end()) { algo = auth.at("algorithm"); }

            std::string response;
            {
                auto H = algo == "SHA-256" ? detail::SHA_256
                    : algo == "SHA-512" ? detail::SHA_512
                    : detail::MD5;

                auto A1 = username + ":" + auth.at("realm") + ":" + password;

                auto A2 = req.method + ":" + req.path;
                if (qop == "auth-int") { A2 += ":" + H(req.body); }

                if (qop.empty()) {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + H(A2));
                } else {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + nc + ":" + cnonce +
                        ":" + qop + ":" + H(A2));
                }
            }

            auto opaque = (auth.find("opaque") != auth.end()) ? auth.at("opaque") : "";

            auto field = "Digest username=\"" + username + "\", realm=\"" +
                auth.at("realm") + "\", nonce=\"" + auth.at("nonce") +
                "\", uri=\"" + req.path + "\", algorithm=" + algo +
                (qop.empty() ? ", response=\""
                    : ", qop=" + qop + ", nc=" + nc + ", cnonce=\"" +
                    cnonce + "\", response=\"") +
                response + "\"" +
                (opaque.empty() ? "" : ", opaque=\"" + opaque + "\"");

            auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
            return std::make_pair(key, field);
        }